

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void * multi_thread_kvs_client(void *args)

{
  double dVar1;
  fdb_kvs_handle *pfVar2;
  fdb_file_handle *pfVar3;
  fdb_custom_cmp_variable __th;
  fdb_doc *pfVar4;
  size_t keylen;
  fdb_iterator *pfVar5;
  fdb_config *pfVar6;
  fdb_config *pfVar7;
  fdb_status fVar8;
  int iVar9;
  fdb_config *pfVar10;
  size_t sVar11;
  fdb_kvs_handle *pfVar12;
  uint8_t *puVar13;
  size_t sVar14;
  size_t sVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  fdb_compaction_callback *in_RCX;
  double *extraout_RDX;
  fdb_compaction_callback *__arg;
  size_t *ptr_handle;
  ulong uVar16;
  fdb_kvs_config *pfVar17;
  fdb_config *pfVar18;
  char cVar19;
  uint uVar20;
  undefined1 *puVar21;
  undefined1 *puVar22;
  undefined1 *puVar23;
  undefined1 *puVar24;
  undefined1 *puVar25;
  undefined1 *puVar26;
  undefined1 *puVar27;
  long lVar28;
  char *pcVar29;
  code *__src;
  fdb_config *unaff_R12;
  code *unaff_R13;
  fdb_config *pfVar30;
  char **config;
  void **doc;
  fdb_config *unaff_R15;
  size_t *psVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  void *pvVar34;
  uint8_t auStackY_1169 [664];
  undefined1 auStackY_ed1 [1152];
  undefined1 auStackY_a51 [233];
  fdb_config local_958;
  undefined8 uStack_830;
  fdb_kvs_config afStack_818 [17];
  undefined1 local_680 [8];
  fdb_config fconfig;
  undefined1 local_538 [168];
  char dbstr [256];
  char metabuf [256];
  char bodybuf [256];
  char keybuf [256];
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_seqnum_t local_68;
  fdb_seqnum_t seqnum;
  fdb_kvs_handle *tdb;
  fdb_config *local_48;
  fdb_config *local_40;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile;
  
  puVar21 = &stack0xfffffffffffffff8;
  puVar22 = &stack0xfffffffffffffff8;
  puVar23 = &stack0xfffffffffffffff8;
  puVar24 = &stack0xfffffffffffffff8;
  puVar25 = &stack0xfffffffffffffff8;
  puVar26 = &stack0xfffffffffffffff8;
  puVar27 = &stack0xfffffffffffffff8;
  pfVar17 = afStack_818;
  pfVar18 = (fdb_config *)afStack_818;
  gettimeofday((timeval *)(keybuf + 0xf8),(__timezone_ptr_t)0x0);
  local_40 = (fdb_config *)0x0;
  if (args != (void *)0x0) {
    pfVar10 = (fdb_config *)(local_538 + 0xa0);
    fdb_get_default_config();
    unaff_R15 = (fdb_config *)local_680;
    memcpy(unaff_R15,pfVar10,0xf8);
    pfVar12 = (fdb_kvs_handle *)&rdoc;
    fVar8 = fdb_open((fdb_file_handle **)pfVar12,"./dummy1",unaff_R15);
    pfVar30 = (fdb_config *)afStack_818;
    if (fVar8 != FDB_RESULT_SUCCESS) goto LAB_001142ce;
    uVar20 = *args;
    args = local_538 + 0xa0;
    sprintf((char *)args,"db%d",(ulong)uVar20);
    pfVar10 = (fdb_config *)(bodybuf + 0xf8);
    fdb_get_default_kvs_config();
    in_RCX = (fdb_compaction_callback *)&__test_begin.tv_usec;
    __test_begin.tv_usec._0_1_ = bodybuf[0xf8];
    __test_begin.tv_usec._1_1_ = bodybuf[0xf9];
    __test_begin.tv_usec._2_1_ = bodybuf[0xfa];
    __test_begin.tv_usec._3_1_ = bodybuf[0xfb];
    __test_begin.tv_usec._4_1_ = bodybuf[0xfc];
    __test_begin.tv_usec._5_1_ = bodybuf[0xfd];
    __test_begin.tv_usec._6_1_ = bodybuf[0xfe];
    __test_begin.tv_usec._7_1_ = bodybuf[0xff];
    pfVar12 = (fdb_kvs_handle *)rdoc;
    fVar8 = fdb_kvs_open((fdb_file_handle *)rdoc,(fdb_kvs_handle **)&seqnum,(char *)args,
                         (fdb_kvs_config *)in_RCX);
    if (fVar8 != FDB_RESULT_SUCCESS) goto LAB_001142d3;
    args = (__suseconds_t *)0x0;
    unaff_R15 = (fdb_config *)0x0;
    do {
      sprintf(bodybuf + 0xf8,"key%d",(ulong)unaff_R15 & 0xffffffff);
      sprintf(dbstr + 0xf8,"meta%d",(ulong)unaff_R15 & 0xffffffff);
      sprintf(metabuf + 0xf8,"body%d",(ulong)unaff_R15 & 0xffffffff);
      unaff_R13 = (code *)((long)args + (long)&afStack_818[0].create_if_missing);
      pfVar10 = (fdb_config *)strlen(bodybuf + 0xf8);
      unaff_R12 = (fdb_config *)strlen(dbstr + 0xf8);
      sVar11 = strlen(metabuf + 0xf8);
      in_RCX = (fdb_compaction_callback *)(dbstr + 0xf8);
      uStack_830 = 0x113e8c;
      fdb_doc_create((fdb_doc **)unaff_R13,bodybuf + 0xf8,(size_t)pfVar10,in_RCX,(size_t)unaff_R12,
                     metabuf + 0xf8,sVar11);
      pfVar12 = (fdb_kvs_handle *)seqnum;
      fVar8 = fdb_set((fdb_kvs_handle *)seqnum,
                      *(fdb_doc **)(&afStack_818[0].create_if_missing + (long)unaff_R15 * 8));
      if (fVar8 != FDB_RESULT_SUCCESS) goto LAB_001142b0;
      fdb_doc_free(*(fdb_doc **)(&afStack_818[0].create_if_missing + (long)unaff_R15 * 8));
      unaff_R15 = (fdb_config *)((long)&unaff_R15->chunksize + 1);
      args = (void *)((long)args + 8);
    } while (unaff_R15 != (fdb_config *)0x32);
    pfVar12 = (fdb_kvs_handle *)rdoc;
    fVar8 = fdb_commit((fdb_file_handle *)rdoc,'\x01');
    pfVar18 = (fdb_config *)afStack_818;
    if (fVar8 == FDB_RESULT_SUCCESS) {
      fdb_close((fdb_file_handle *)rdoc);
      return (void *)0x0;
    }
    goto LAB_001142dd;
  }
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  args = local_538 + 0xa0;
  fdb_get_default_config();
  pfVar10 = (fdb_config *)local_680;
  memcpy(pfVar10,args,0xf8);
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.flags._3_1_ = 0;
  pfVar12 = (fdb_kvs_handle *)&rdoc;
  fVar8 = fdb_open((fdb_file_handle **)pfVar12,"./dummy1",pfVar10);
  pfVar18 = (fdb_config *)afStack_818;
  if (fVar8 != FDB_RESULT_SUCCESS) goto LAB_001142d8;
  local_48 = (fdb_config *)(local_958.encryption_key.bytes + 0xc);
  pfVar18 = &local_958;
  pfVar10 = (fdb_config *)(local_538 + 0xa0);
  args = &__test_begin.tv_usec;
  unaff_R15 = (fdb_config *)0x0;
  unaff_R13 = (code *)0x0;
  do {
    sprintf((char *)pfVar10,"db%d",(ulong)unaff_R13 & 0xffffffff);
    fdb_get_default_kvs_config();
    __test_begin.tv_usec._0_1_ = bodybuf[0xf8];
    __test_begin.tv_usec._1_1_ = bodybuf[0xf9];
    __test_begin.tv_usec._2_1_ = bodybuf[0xfa];
    __test_begin.tv_usec._3_1_ = bodybuf[0xfb];
    __test_begin.tv_usec._4_1_ = bodybuf[0xfc];
    __test_begin.tv_usec._5_1_ = bodybuf[0xfd];
    __test_begin.tv_usec._6_1_ = bodybuf[0xfe];
    __test_begin.tv_usec._7_1_ = bodybuf[0xff];
    in_RCX = (fdb_compaction_callback *)args;
    pfVar12 = (fdb_kvs_handle *)rdoc;
    fVar8 = fdb_kvs_open((fdb_file_handle *)rdoc,(fdb_kvs_handle **)(local_538 + (long)unaff_R15),
                         (char *)pfVar10,(fdb_kvs_config *)args);
    unaff_R12 = pfVar18;
    if (fVar8 != FDB_RESULT_SUCCESS) goto LAB_001142ba;
    pfVar12 = *(fdb_kvs_handle **)(local_538 + (long)unaff_R13 * 8);
    fVar8 = fdb_kvs_close(pfVar12);
    if (fVar8 != FDB_RESULT_SUCCESS) goto LAB_001142b5;
    unaff_R13 = (code *)((bool *)unaff_R13 + 1);
    unaff_R15 = (fdb_config *)&unaff_R15->buffercache_size;
  } while (unaff_R13 != (code *)0x14);
  __arg = (fdb_compaction_callback *)&fconfig.num_blocks_readahead;
  lVar28 = 0;
  unaff_R15 = local_48;
  do {
    *(int *)__arg = (int)lVar28;
    in_RCX = __arg;
    pthread_create((pthread_t *)unaff_R15,(pthread_attr_t *)0x0,multi_thread_kvs_client,__arg);
    pfVar10 = local_48;
    lVar28 = lVar28 + 1;
    unaff_R15 = (fdb_config *)&unaff_R15->buffercache_size;
    __arg = (fdb_compaction_callback *)((long)__arg + 4);
  } while (lVar28 != 0x14);
  lVar28 = 0;
  do {
    pthread_join(*(pthread_t *)((long)&pfVar10->chunksize + lVar28),
                 (void **)((long)&pfVar18->chunksize + lVar28));
    lVar28 = lVar28 + 8;
  } while (lVar28 != 0xa0);
  pfVar12 = (fdb_kvs_handle *)rdoc;
  fVar8 = fdb_commit((fdb_file_handle *)rdoc,'\0');
  unaff_R13 = (code *)0x14;
  args = (__suseconds_t *)0xa0;
  if (fVar8 != FDB_RESULT_SUCCESS) goto LAB_001142e2;
  unaff_R12 = (fdb_config *)(bodybuf + 0xf8);
  pfVar10 = (fdb_config *)0x0;
  do {
    args = local_538 + 0xa0;
    sprintf((char *)args,"db%d",(ulong)pfVar10 & 0xffffffff);
    fdb_get_default_kvs_config();
    __test_begin.tv_usec = seqnum;
    unaff_R15 = (fdb_config *)(local_538 + (long)pfVar10 * 8);
    in_RCX = (fdb_compaction_callback *)&__test_begin.tv_usec;
    pfVar12 = (fdb_kvs_handle *)rdoc;
    fVar8 = fdb_kvs_open((fdb_file_handle *)rdoc,(fdb_kvs_handle **)unaff_R15,(char *)args,
                         (fdb_kvs_config *)in_RCX);
    if (fVar8 != FDB_RESULT_SUCCESS) goto LAB_001142bf;
    pfVar12 = *(fdb_kvs_handle **)unaff_R15;
    fVar8 = fdb_get_kvs_seqnum(pfVar12,&local_68);
    if (fVar8 != FDB_RESULT_SUCCESS) goto LAB_001142c4;
    local_48 = pfVar10;
    if (local_68 != 0x32) {
      multi_thread_kvs_client();
    }
    unaff_R13 = (code *)0x0;
    do {
      sprintf((char *)unaff_R12,"key%d",unaff_R13);
      sprintf(dbstr + 0xf8,"meta%d",unaff_R13);
      sprintf(metabuf + 0xf8,"body%d",unaff_R13);
      sVar11 = strlen((char *)unaff_R12);
      in_RCX = (fdb_compaction_callback *)0x0;
      fdb_doc_create((fdb_doc **)&local_40,unaff_R12,sVar11,(void *)0x0,0,(void *)0x0,0);
      pfVar12 = *(fdb_kvs_handle **)unaff_R15;
      fVar8 = fdb_get(pfVar12,(fdb_doc *)local_40);
      pfVar30 = local_40;
      if (fVar8 != FDB_RESULT_SUCCESS) {
        multi_thread_kvs_client();
        goto LAB_001142b0;
      }
      args = *(void **)&local_40->seqtree_opt;
      sVar11 = strlen((char *)unaff_R12);
      iVar9 = bcmp(args,unaff_R12,sVar11);
      if (iVar9 != 0) {
        multi_thread_kvs_client();
        pfVar30 = (fdb_config *)seqnum;
      }
      iVar9 = bcmp((void *)pfVar30->compactor_sleep_duration,dbstr + 0xf8,pfVar30->buffercache_size)
      ;
      if (iVar9 != 0) {
        multi_thread_kvs_client();
        pfVar30 = (fdb_config *)seqnum;
      }
      iVar9 = bcmp(*(void **)&pfVar30->multi_kv_instances,metabuf + 0xf8,pfVar30->wal_threshold);
      pfVar10 = pfVar30;
      if (iVar9 != 0) {
        multi_thread_kvs_client();
        pfVar10 = (fdb_config *)seqnum;
      }
      fdb_doc_free((fdb_doc *)pfVar10);
      uVar20 = (int)unaff_R13 + 1;
      unaff_R13 = (code *)(ulong)uVar20;
    } while (uVar20 != 0x32);
    pfVar12 = *(fdb_kvs_handle **)unaff_R15;
    fVar8 = fdb_kvs_close(pfVar12);
    if (fVar8 != FDB_RESULT_SUCCESS) goto LAB_001142c9;
    pfVar10 = (fdb_config *)((long)&local_48->chunksize + 1);
  } while (pfVar10 != (fdb_config *)0x14);
  fVar8 = fdb_close((fdb_file_handle *)rdoc);
  pfVar12 = (fdb_kvs_handle *)rdoc;
  if (fVar8 == FDB_RESULT_SUCCESS) {
    fdb_shutdown();
    memleak_end();
    if (multi_thread_kvs_client(void*)::__test_pass == '\0') {
      pcVar29 = "%s PASSED\n";
    }
    else {
      pcVar29 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar29,"multi thread kvs client");
    return (void *)0x0;
  }
  goto LAB_001142e7;
LAB_001146d9:
  pfVar18[-2].max_writer_lock_prob = 0x1146de;
  multi_thread_fhandle_share();
LAB_001146de:
  pfVar18[-2].max_writer_lock_prob = 0x1146e3;
  multi_thread_fhandle_share();
LAB_001146e3:
  pfVar18[-2].max_writer_lock_prob = 0x1146e8;
  multi_thread_fhandle_share();
LAB_001146e8:
  puVar13 = pfVar18[-2].encryption_key.bytes + 4;
  pcVar29 = "key%03d";
  pfVar18[-2].max_writer_lock_prob = 0x1146ed;
  multi_thread_fhandle_share();
  goto LAB_001146ed;
LAB_00114e32:
  pfVar10 = pfVar18 + -0xb;
  builtin_memcpy((pfVar10->encryption_key).bytes + 0x14,"7N\x11",4);
  (pfVar10->encryption_key).bytes[0x18] = '\0';
  (pfVar10->encryption_key).bytes[0x19] = '\0';
  (pfVar10->encryption_key).bytes[0x1a] = '\0';
  (pfVar10->encryption_key).bytes[0x1b] = '\0';
  custom_compare_primitive_test();
LAB_00114e37:
  pfVar10 = pfVar18 + -0xb;
  builtin_memcpy((pfVar10->encryption_key).bytes + 0x14,"<N\x11",4);
  (pfVar10->encryption_key).bytes[0x18] = '\0';
  (pfVar10->encryption_key).bytes[0x19] = '\0';
  (pfVar10->encryption_key).bytes[0x1a] = '\0';
  (pfVar10->encryption_key).bytes[0x1b] = '\0';
  custom_compare_primitive_test();
LAB_00114e3c:
  pfVar10 = pfVar18 + -0xb;
  builtin_memcpy((pfVar10->encryption_key).bytes + 0x14,"AN\x11",4);
  (pfVar10->encryption_key).bytes[0x18] = '\0';
  (pfVar10->encryption_key).bytes[0x19] = '\0';
  (pfVar10->encryption_key).bytes[0x1a] = '\0';
  (pfVar10->encryption_key).bytes[0x1b] = '\0';
  custom_compare_primitive_test();
  goto LAB_00114e41;
LAB_001142b0:
  pfVar18[-1].num_blocks_readahead = 0x1142b5;
  pfVar18[-1].bottom_up_index_build = false;
  *(undefined3 *)&pfVar18[-1].field_0xf5 = 0;
  multi_thread_kvs_client();
LAB_001142b5:
  pfVar18[-1].num_blocks_readahead = 0x1142ba;
  pfVar18[-1].bottom_up_index_build = false;
  *(undefined3 *)&pfVar18[-1].field_0xf5 = 0;
  multi_thread_kvs_client();
LAB_001142ba:
  pfVar18[-1].num_blocks_readahead = 0x1142bf;
  pfVar18[-1].bottom_up_index_build = false;
  *(undefined3 *)&pfVar18[-1].field_0xf5 = 0;
  multi_thread_kvs_client();
LAB_001142bf:
  pfVar18[-1].num_blocks_readahead = 0x1142c4;
  pfVar18[-1].bottom_up_index_build = false;
  *(undefined3 *)&pfVar18[-1].field_0xf5 = 0;
  multi_thread_kvs_client();
LAB_001142c4:
  pfVar18[-1].num_blocks_readahead = 0x1142c9;
  pfVar18[-1].bottom_up_index_build = false;
  *(undefined3 *)&pfVar18[-1].field_0xf5 = 0;
  multi_thread_kvs_client();
LAB_001142c9:
  pfVar18[-1].num_blocks_readahead = 0x1142ce;
  pfVar18[-1].bottom_up_index_build = false;
  *(undefined3 *)&pfVar18[-1].field_0xf5 = 0;
  multi_thread_kvs_client();
  pfVar30 = pfVar18;
LAB_001142ce:
  pfVar17 = (fdb_kvs_config *)pfVar30;
  *(undefined8 *)((long)pfVar17 + -8) = 0x1142d3;
  multi_thread_kvs_client();
LAB_001142d3:
  *(undefined8 *)((long)pfVar17 + -8) = 0x1142d8;
  multi_thread_kvs_client();
  pfVar18 = (fdb_config *)pfVar17;
LAB_001142d8:
  *(undefined8 *)((long)pfVar18 + -8) = 0x1142dd;
  multi_thread_kvs_client();
LAB_001142dd:
  *(undefined8 *)((long)pfVar18 + -8) = 0x1142e2;
  multi_thread_kvs_client();
LAB_001142e2:
  pfVar18[-1].num_blocks_readahead = 0x1142e7;
  pfVar18[-1].bottom_up_index_build = false;
  *(undefined3 *)&pfVar18[-1].field_0xf5 = 0;
  multi_thread_kvs_client();
LAB_001142e7:
  *(code **)&pfVar18[-1].num_blocks_readahead = multi_thread_fhandle_share;
  multi_thread_kvs_client();
  *(undefined1 **)&pfVar18[-1].num_blocks_readahead = &stack0xfffffffffffffff8;
  *(fdb_config **)&pfVar18[-1].do_not_move_to_compacted_file = unaff_R15;
  pfVar18[-1].log_msg_level = (size_t)pfVar10;
  pfVar18[-1].breakpad_minidump_dir = (char *)unaff_R13;
  pfVar18[-1].num_keeping_headers = (size_t)unaff_R12;
  pfVar18[-1].max_block_reusing_cycle = (size_t)args;
  pfVar18[-2].max_writer_lock_prob = 0x11430c;
  gettimeofday((timeval *)&pfVar18[-2].block_reusing_threshold,(__timezone_ptr_t)0x0);
  if (pfVar12 != (fdb_kvs_handle *)0x0) {
    if (*(char *)&pfVar12->op_stats == '\0') {
      if (((ulong)pfVar12->op_stats & 0x100) == 0) {
        puVar13 = pfVar18[-2].encryption_key.bytes + 4;
        unaff_R12 = (fdb_config *)&pfVar18[-2].max_block_reusing_cycle;
        unaff_R13 = (code *)&pfVar18[-2].enable_background_compactor;
        puVar21 = (undefined1 *)0x0;
        do {
          pfVar18[-2].max_block_reusing_cycle = 0;
          pfVar18[-2].max_writer_lock_prob = 0x1143fa;
          sprintf((char *)puVar13,"key%03d",puVar21);
          pfVar2 = (fdb_kvs_handle *)(pfVar12->kvs_config).custom_cmp_param;
          pfVar18[-2].max_writer_lock_prob = 0x114411;
          in_RCX = (fdb_compaction_callback *)unaff_R12;
          fVar8 = fdb_get_kv(pfVar2,puVar13,7,(void **)unaff_R12,(size_t *)unaff_R13);
          if (fVar8 == FDB_RESULT_HANDLE_BUSY) {
            pfVar18[-2].max_writer_lock_prob = 0x1146cf;
            multi_thread_fhandle_share();
LAB_001146cf:
            pfVar18[-2].max_writer_lock_prob = 0x1146d4;
            multi_thread_fhandle_share();
LAB_001146d4:
            pfVar18[-2].max_writer_lock_prob = 0x1146d9;
            multi_thread_fhandle_share();
            goto LAB_001146d9;
          }
          pfVar2 = (fdb_kvs_handle *)pfVar12->kvs;
          pfVar18[-2].max_writer_lock_prob = 0x114431;
          in_RCX = (fdb_compaction_callback *)unaff_R12;
          fVar8 = fdb_get_kv(pfVar2,puVar13,7,(void **)unaff_R12,(size_t *)unaff_R13);
          if (fVar8 == FDB_RESULT_HANDLE_BUSY) goto LAB_001146cf;
          pfVar2 = (fdb_kvs_handle *)(pfVar12->kvs_config).custom_cmp;
          pfVar18[-2].max_writer_lock_prob = 0x114451;
          in_RCX = (fdb_compaction_callback *)unaff_R12;
          fVar8 = fdb_get_kv(pfVar2,puVar13,7,(void **)unaff_R12,(size_t *)unaff_R13);
          if (fVar8 == FDB_RESULT_HANDLE_BUSY) goto LAB_001146d4;
          uVar20 = (int)puVar21 + 1;
          puVar21 = (undefined1 *)(ulong)uVar20;
        } while ((uVar20 != 2000) ||
                (puVar21 = (undefined1 *)0x0, ((ulong)pfVar12->op_stats & 0x100) == 0));
      }
    }
    else {
      puVar13 = pfVar18[-2].encryption_key.bytes + 4;
      puVar21 = (undefined1 *)0x0;
      do {
        pfVar18[-2].max_writer_lock_prob = 0x11433c;
        sprintf((char *)puVar13,"key%03d",puVar21);
        pfVar2 = (fdb_kvs_handle *)(pfVar12->kvs_config).custom_cmp_param;
        in_RCX = (fdb_compaction_callback *)0x0;
        pfVar18[-2].max_writer_lock_prob = 0x114352;
        fVar8 = fdb_set_kv(pfVar2,puVar13,7,(void *)0x0,0);
        if (fVar8 != FDB_RESULT_SUCCESS) goto LAB_001146e8;
        pfVar2 = (fdb_kvs_handle *)pfVar12->kvs;
        in_RCX = (fdb_compaction_callback *)0x0;
        pfVar18[-2].max_writer_lock_prob = 0x114370;
        fVar8 = fdb_set_kv(pfVar2,puVar13,7,(void *)0x0,0);
        if (fVar8 != FDB_RESULT_SUCCESS) goto LAB_001146e3;
        pfVar2 = (fdb_kvs_handle *)(pfVar12->kvs_config).custom_cmp;
        in_RCX = (fdb_compaction_callback *)0x0;
        pfVar18[-2].max_writer_lock_prob = 0x11438e;
        fVar8 = fdb_set_kv(pfVar2,puVar13,7,(void *)0x0,0);
        if (fVar8 != FDB_RESULT_SUCCESS) goto LAB_001146de;
        pfVar3 = *(fdb_file_handle **)&pfVar12->kvs_config;
        pfVar18[-2].max_writer_lock_prob = 0x1143a3;
        fVar8 = fdb_commit(pfVar3,'\x01');
        if (fVar8 == FDB_RESULT_HANDLE_BUSY) goto LAB_001146d9;
        uVar20 = (int)puVar21 + 1;
        puVar21 = (undefined1 *)(ulong)uVar20;
      } while (uVar20 != 2000);
    }
    return (void *)0x0;
  }
  pfVar18[-2].max_writer_lock_prob = 0x114487;
  pfVar12 = (fdb_kvs_handle *)malloc(0x10);
  pfVar18[-2].max_writer_lock_prob = 0x114494;
  pcVar29 = (char *)malloc(0x50);
  pfVar18[-2].max_writer_lock_prob = 0x1144a1;
  puVar13 = (uint8_t *)malloc(0x10);
  pfVar18[-2].max_writer_lock_prob = 0x1144b0;
  system("rm -rf  func_test* > errorlog.txt");
  unaff_R12 = (fdb_config *)&pfVar18[-2].max_block_reusing_cycle;
  pfVar18[-2].max_writer_lock_prob = 0x1144bd;
  fdb_get_default_config();
  pfVar18[-2].num_keeping_headers = 0;
  pfVar18[-2].field_0xf7 = 0;
  pfVar18[-1].prefetch_duration = 1;
  pfVar18[-2].max_writer_lock_prob = 0x1144df;
  fdb_get_default_kvs_config();
  unaff_R13 = (code *)(pfVar18[-2].encryption_key.bytes + 4);
  pfVar18[-2].max_writer_lock_prob = 0x1144f7;
  sprintf((char *)unaff_R13,"./func_test_pt.%d",0);
  pfVar18[-2].max_writer_lock_prob = 0x114505;
  fVar8 = fdb_open((fdb_file_handle **)&pfVar18[-2].num_compactor_threads,(char *)unaff_R13,
                   unaff_R12);
  if (fVar8 == FDB_RESULT_SUCCESS) {
    pfVar3 = (fdb_file_handle *)pfVar18[-2].num_compactor_threads;
    *(fdb_file_handle **)pcVar29 = pfVar3;
    *(fdb_file_handle **)(pcVar29 + 0x28) = pfVar3;
    pcVar29[0x20] = '\x01';
    pcVar29[0x48] = '\0';
    pfVar18[-2].max_writer_lock_prob = 0x114530;
    fVar8 = fdb_kvs_open_default
                      (pfVar3,(fdb_kvs_handle **)(pcVar29 + 0x30),
                       (fdb_kvs_config *)&pfVar18[-2].enable_background_compactor);
    if (fVar8 != FDB_RESULT_SUCCESS) goto LAB_001146f2;
    in_RCX = (fdb_compaction_callback *)&pfVar18[-2].enable_background_compactor;
    pfVar18[-2].max_writer_lock_prob = 0x114551;
    fVar8 = fdb_kvs_open((fdb_file_handle *)pfVar18[-2].num_compactor_threads,
                         (fdb_kvs_handle **)(pcVar29 + 0x38),"main",(fdb_kvs_config *)in_RCX);
    if (fVar8 != FDB_RESULT_SUCCESS) goto LAB_001146f7;
    in_RCX = (fdb_compaction_callback *)&pfVar18[-2].enable_background_compactor;
    pfVar18[-2].max_writer_lock_prob = 0x114572;
    fVar8 = fdb_kvs_open((fdb_file_handle *)pfVar18[-2].num_compactor_threads,
                         (fdb_kvs_handle **)(pcVar29 + 0x40),"back",(fdb_kvs_config *)in_RCX);
    if (fVar8 != FDB_RESULT_SUCCESS) goto LAB_001146fc;
    pfVar18[-2].max_writer_lock_prob = 0x11458c;
    fVar8 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfVar18[-2].num_compactor_threads,
                       (fdb_kvs_handle **)(pcVar29 + 8),
                       (fdb_kvs_config *)&pfVar18[-2].enable_background_compactor);
    if (fVar8 != FDB_RESULT_SUCCESS) goto LAB_00114701;
    in_RCX = (fdb_compaction_callback *)&pfVar18[-2].enable_background_compactor;
    pfVar18[-2].max_writer_lock_prob = 0x1145ad;
    fVar8 = fdb_kvs_open((fdb_file_handle *)pfVar18[-2].num_compactor_threads,
                         (fdb_kvs_handle **)(pcVar29 + 0x10),"main",(fdb_kvs_config *)in_RCX);
    if (fVar8 != FDB_RESULT_SUCCESS) goto LAB_00114706;
    in_RCX = (fdb_compaction_callback *)&pfVar18[-2].enable_background_compactor;
    pfVar18[-2].max_writer_lock_prob = 0x1145ce;
    fVar8 = fdb_kvs_open((fdb_file_handle *)pfVar18[-2].num_compactor_threads,
                         (fdb_kvs_handle **)(pcVar29 + 0x18),"back",(fdb_kvs_config *)in_RCX);
    if (fVar8 != FDB_RESULT_SUCCESS) goto LAB_0011470b;
    pfVar18[-2].max_writer_lock_prob = 0x1145ee;
    printf("Creating %d writers+readers over %d docs..\n",1,2000);
    unaff_R12 = (fdb_config *)(pcVar29 + 0x28);
    lVar28 = 8;
    unaff_R13 = multi_thread_fhandle_share;
    do {
      LOCK();
      *(bool *)((long)unaff_R12 + 0x21) = false;
      UNLOCK();
      pfVar18[-2].max_writer_lock_prob = 0x114619;
      in_RCX = (fdb_compaction_callback *)unaff_R12;
      pthread_create((pthread_t *)(&(pfVar12->kvs_config).create_if_missing + lVar28),
                     (pthread_attr_t *)0x0,multi_thread_fhandle_share,unaff_R12);
      lVar28 = lVar28 + -8;
      unaff_R12 = (fdb_config *)((long)unaff_R12 + -0x28);
    } while (lVar28 != -8);
    pfVar3 = *(fdb_file_handle **)&pfVar12->kvs_config;
    pfVar18[-2].max_writer_lock_prob = 0x114632;
    pthread_join((pthread_t)pfVar3,(void **)puVar13);
    pfVar18[-2].max_writer_lock_prob = 0x114642;
    printf("Writer %d done\n",0);
    LOCK();
    pcVar29[0x49] = '\x01';
    UNLOCK();
    __th = (pfVar12->kvs_config).custom_cmp;
    pfVar18[-2].max_writer_lock_prob = 0x114658;
    pthread_join((pthread_t)__th,(void **)(puVar13 + 8));
    pfVar3 = *(fdb_file_handle **)pcVar29;
    pfVar18[-2].max_writer_lock_prob = 0x114660;
    fVar8 = fdb_close(pfVar3);
    puVar27 = (undefined1 *)0xfffffffffffffff8;
    if (fVar8 == FDB_RESULT_SUCCESS) {
      pfVar18[-2].max_writer_lock_prob = 0x114670;
      free(pfVar12);
      pfVar18[-2].max_writer_lock_prob = 0x114678;
      free(pcVar29);
      pfVar18[-2].max_writer_lock_prob = 0x114680;
      free(puVar13);
      pfVar18[-2].max_writer_lock_prob = 0x114685;
      fdb_shutdown();
      pcVar29 = "%s PASSED\n";
      if (multi_thread_fhandle_share(void*)::__test_pass != '\0') {
        pcVar29 = "%s FAILED\n";
      }
      pfVar18[-2].max_writer_lock_prob = 0x1146b6;
      fprintf(_stderr,pcVar29,"multi thread file handle share test");
      return (void *)0x0;
    }
  }
  else {
LAB_001146ed:
    pfVar18[-2].max_writer_lock_prob = 0x1146f2;
    multi_thread_fhandle_share();
    puVar22 = puVar21;
LAB_001146f2:
    pfVar18[-2].max_writer_lock_prob = 0x1146f7;
    multi_thread_fhandle_share();
    puVar23 = puVar22;
LAB_001146f7:
    pfVar18[-2].max_writer_lock_prob = 0x1146fc;
    multi_thread_fhandle_share();
    puVar24 = puVar23;
LAB_001146fc:
    pfVar18[-2].max_writer_lock_prob = 0x114701;
    multi_thread_fhandle_share();
    puVar25 = puVar24;
LAB_00114701:
    pfVar18[-2].max_writer_lock_prob = 0x114706;
    multi_thread_fhandle_share();
    puVar26 = puVar25;
LAB_00114706:
    pfVar18[-2].max_writer_lock_prob = 0x11470b;
    multi_thread_fhandle_share();
    puVar27 = puVar26;
LAB_0011470b:
    pfVar18[-2].max_writer_lock_prob = 0x114710;
    multi_thread_fhandle_share();
  }
  pfVar18[-2].max_writer_lock_prob = (size_t)incomplete_block_test;
  multi_thread_fhandle_share();
  pfVar18[-2].max_writer_lock_prob = (size_t)puVar27;
  pfVar18[-2].compaction_cb_ctx = puVar13;
  *(char **)&pfVar18[-2].compaction_cb_mask = pcVar29;
  pfVar18[-2].compaction_cb = unaff_R13;
  *(fdb_config **)&pfVar18[-2].num_wal_partitions = unaff_R12;
  pfVar18[-2].prefetch_duration = (uint64_t)pfVar12;
  *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x114735;
  gettimeofday((timeval *)(pfVar18 + -6),(__timezone_ptr_t)0x0);
  *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x11473a;
  memleak_start();
  pfVar18[-7].max_block_reusing_cycle = 0;
  *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x11474b;
  system("rm -rf  dummy* > errorlog.txt");
  *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x114758;
  fdb_get_default_config();
  config = (char **)&pfVar18[-6].wal_threshold;
  *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x114765;
  fdb_get_default_kvs_config();
  pfVar18[-6].compaction_minimum_filesize = 0;
  pfVar18[-6].compactor_sleep_duration = 0x400;
  *(undefined4 *)((long)&pfVar18[-6].prefetch_duration + 4) = 1;
  pfVar18[-6].field_0x57 = 0;
  psVar31 = (size_t *)&pfVar18[-7].num_blocks_readahead;
  *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x114793;
  fdb_open((fdb_file_handle **)psVar31,"./dummy1",(fdb_config *)&pfVar18[-6].compaction_buf_maxsize)
  ;
  pfVar3 = (fdb_file_handle *)*psVar31;
  ptr_handle = &pfVar18[-7].num_keeping_headers;
  *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x1147a6;
  fdb_kvs_open_default(pfVar3,(fdb_kvs_handle **)ptr_handle,(fdb_kvs_config *)config);
  pfVar12 = (fdb_kvs_handle *)*ptr_handle;
  *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x1147bc;
  fVar8 = fdb_set_log_callback(pfVar12,logCallbackFunc,"incomplete_block_test");
  if (fVar8 == FDB_RESULT_SUCCESS) {
    ptr_handle = &pfVar18[-3].compactor_sleep_duration;
    *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x1147df;
    sprintf((char *)ptr_handle,"key%d",0);
    unaff_R12 = (fdb_config *)&pfVar18[-4].compaction_minimum_filesize;
    *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x1147fa;
    sprintf((char *)unaff_R12,"meta%d",0);
    unaff_R13 = (code *)&pfVar18[-5].compaction_buf_maxsize;
    *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x114815;
    sprintf((char *)unaff_R13,"body%d",0);
    *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x11481d;
    sVar11 = strlen((char *)ptr_handle);
    *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x114828;
    sVar14 = strlen((char *)unaff_R12);
    *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x114833;
    sVar15 = strlen((char *)unaff_R13);
    pfVar18[-7].block_reusing_threshold = sVar15;
    config = &pfVar18[-7].breakpad_minidump_dir;
    *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x114853;
    fdb_doc_create((fdb_doc **)config,ptr_handle,sVar11,unaff_R12,sVar14,unaff_R13,
                   pfVar18[-7].block_reusing_threshold);
    pfVar12 = (fdb_kvs_handle *)pfVar18[-7].num_keeping_headers;
    pfVar4 = (fdb_doc *)*config;
    *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x114860;
    fdb_set(pfVar12,pfVar4);
    *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x114876;
    sprintf((char *)ptr_handle,"key%d",1);
    *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x11488c;
    sprintf((char *)unaff_R12,"meta%d",1);
    *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x1148a2;
    sprintf((char *)unaff_R13,"body%d",1);
    *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x1148aa;
    sVar11 = strlen((char *)ptr_handle);
    *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x1148b5;
    sVar14 = strlen((char *)unaff_R12);
    *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x1148c0;
    sVar15 = strlen((char *)unaff_R13);
    pfVar18[-7].block_reusing_threshold = sVar15;
    *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x1148dd;
    fdb_doc_create((fdb_doc **)&pfVar18[-7].log_msg_level,ptr_handle,sVar11,unaff_R12,sVar14,
                   unaff_R13,pfVar18[-7].block_reusing_threshold);
    pfVar12 = (fdb_kvs_handle *)pfVar18[-7].num_keeping_headers;
    pfVar4 = (fdb_doc *)pfVar18[-7].log_msg_level;
    *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x1148eb;
    fdb_set(pfVar12,pfVar4);
    puVar27 = (undefined1 *)CONCAT71((int7)(sVar14 >> 8),1);
    psVar31 = &pfVar18[-7].max_block_reusing_cycle;
    while( true ) {
      keylen = *(size_t *)*config;
      pvVar34 = *(void **)((long)*config + 0x20);
      pfVar18[-7].block_reusing_threshold = 0;
      in_RCX = (fdb_compaction_callback *)0x0;
      *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x114915;
      fdb_doc_create((fdb_doc **)psVar31,pvVar34,keylen,(void *)0x0,0,(void *)0x0,
                     pfVar18[-7].block_reusing_threshold);
      pfVar12 = (fdb_kvs_handle *)pfVar18[-7].num_keeping_headers;
      pfVar4 = (fdb_doc *)pfVar18[-7].max_block_reusing_cycle;
      *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x114924;
      fVar8 = fdb_get(pfVar12,pfVar4);
      if (fVar8 != FDB_RESULT_SUCCESS) break;
      unaff_R12 = (fdb_config *)pfVar18[-7].max_block_reusing_cycle;
      sVar11 = unaff_R12->buffercache_size;
      unaff_R13 = (code *)unaff_R12->compactor_sleep_duration;
      ptr_handle = (size_t *)*config;
      config = (char **)ptr_handle[7];
      *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x11494d;
      iVar9 = bcmp(unaff_R13,config,sVar11);
      if (iVar9 != 0) goto LAB_00114a15;
      sVar11 = unaff_R12->wal_threshold;
      config = *(char ***)&unaff_R12->multi_kv_instances;
      unaff_R13 = (code *)ptr_handle[8];
      *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x11496e;
      iVar9 = bcmp(config,unaff_R13,sVar11);
      if (iVar9 != 0) goto LAB_00114a20;
      *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x11497e;
      fdb_doc_free((fdb_doc *)unaff_R12);
      pfVar18[-7].max_block_reusing_cycle = 0;
      config = (char **)&pfVar18[-7].log_msg_level;
      cVar19 = (char)puVar27;
      puVar27 = (undefined1 *)0x0;
      if (cVar19 == '\0') {
        pfVar12 = (fdb_kvs_handle *)pfVar18[-7].num_keeping_headers;
        *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x1149a5;
        fdb_kvs_close(pfVar12);
        pfVar3 = *(fdb_file_handle **)&pfVar18[-7].num_blocks_readahead;
        *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x1149af;
        fdb_close(pfVar3);
        pfVar4 = (fdb_doc *)pfVar18[-7].breakpad_minidump_dir;
        *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x1149b9;
        fdb_doc_free(pfVar4);
        pfVar4 = (fdb_doc *)pfVar18[-7].log_msg_level;
        *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x1149c3;
        fdb_doc_free(pfVar4);
        *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x1149c8;
        fdb_shutdown();
        *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x1149cd;
        memleak_end();
        pcVar29 = "%s PASSED\n";
        if (incomplete_block_test()::__test_pass != '\0') {
          pcVar29 = "%s FAILED\n";
        }
        *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x1149fe;
        iVar9 = fprintf(_stderr,pcVar29,"incomplete block test");
        return (void *)CONCAT44(extraout_var,iVar9);
      }
    }
    *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x114a15;
    incomplete_block_test();
LAB_00114a15:
    *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x114a20;
    incomplete_block_test();
LAB_00114a20:
    *(undefined8 *)(pfVar18[-7].encryption_key.bytes + 0x1c) = 0x114a2b;
    incomplete_block_test();
  }
  *(code **)(pfVar18[-7].encryption_key.bytes + 0x1c) = custom_compare_primitive_test;
  incomplete_block_test();
  *(undefined1 **)(pfVar18[-7].encryption_key.bytes + 0x1c) = puVar27;
  *(size_t **)(pfVar18[-7].encryption_key.bytes + 0x14) = psVar31;
  *(char ***)(pfVar18[-7].encryption_key.bytes + 0xc) = config;
  *(code **)(pfVar18[-7].encryption_key.bytes + 4) = unaff_R13;
  *(fdb_config **)&pfVar18[-7].encryption_key = unaff_R12;
  pfVar18[-7].num_bgflusher_threads = (size_t)ptr_handle;
  pfVar10 = pfVar18 + -0xb;
  pfVar30 = pfVar18 + -0xb;
  pfVar6 = pfVar18 + -0xb;
  uVar16 = 0;
  pfVar7 = pfVar18 + -0xb;
  builtin_memcpy((pfVar7->encryption_key).bytes + 0x14,"OJ\x11",4);
  (pfVar7->encryption_key).bytes[0x18] = '\0';
  (pfVar7->encryption_key).bytes[0x19] = '\0';
  (pfVar7->encryption_key).bytes[0x1a] = '\0';
  (pfVar7->encryption_key).bytes[0x1b] = '\0';
  gettimeofday((timeval *)&pfVar18[-0xb].do_not_move_to_compacted_file,(__timezone_ptr_t)0x0);
  pfVar7 = pfVar18 + -0xb;
  builtin_memcpy((pfVar7->encryption_key).bytes + 0x14,"TJ\x11",4);
  (pfVar7->encryption_key).bytes[0x18] = '\0';
  (pfVar7->encryption_key).bytes[0x19] = '\0';
  (pfVar7->encryption_key).bytes[0x1a] = '\0';
  (pfVar7->encryption_key).bytes[0x1b] = '\0';
  memleak_start();
  pfVar18[-0xb].max_block_reusing_cycle = 0;
  pfVar7 = pfVar18 + -0xb;
  builtin_memcpy((pfVar7->encryption_key).bytes + 0x14,"eJ\x11",4);
  (pfVar7->encryption_key).bytes[0x18] = '\0';
  (pfVar7->encryption_key).bytes[0x19] = '\0';
  (pfVar7->encryption_key).bytes[0x1a] = '\0';
  (pfVar7->encryption_key).bytes[0x1b] = '\0';
  system("rm -rf  dummy* > errorlog.txt");
  pfVar7 = pfVar18 + -0xb;
  builtin_memcpy((pfVar7->encryption_key).bytes + 0x14,"uJ\x11",4);
  (pfVar7->encryption_key).bytes[0x18] = '\0';
  (pfVar7->encryption_key).bytes[0x19] = '\0';
  (pfVar7->encryption_key).bytes[0x1a] = '\0';
  (pfVar7->encryption_key).bytes[0x1b] = '\0';
  fdb_get_default_config();
  pfVar7 = pfVar18 + -0xb;
  (pfVar7->encryption_key).bytes[0x14] = 0x82;
  (pfVar7->encryption_key).bytes[0x15] = 'J';
  (pfVar7->encryption_key).bytes[0x16] = '\x11';
  (pfVar7->encryption_key).bytes[0x17] = '\0';
  (pfVar7->encryption_key).bytes[0x18] = '\0';
  (pfVar7->encryption_key).bytes[0x19] = '\0';
  (pfVar7->encryption_key).bytes[0x1a] = '\0';
  (pfVar7->encryption_key).bytes[0x1b] = '\0';
  fdb_get_default_kvs_config();
  *(undefined8 *)&pfVar18[-9].enable_background_compactor = 0;
  pfVar18[-9].num_bgflusher_threads = 0x400;
  pfVar7 = pfVar18 + -9;
  (pfVar7->encryption_key).bytes[8] = '\x01';
  (pfVar7->encryption_key).bytes[9] = '\0';
  (pfVar7->encryption_key).bytes[10] = '\0';
  (pfVar7->encryption_key).bytes[0xb] = '\0';
  pfVar18[-9].encryption_key.bytes[0x13] = '\0';
  *(undefined1 *)&pfVar18[-9].block_reusing_threshold = 1;
  pfVar18[-10].buffercache_size = (uint64_t)_cmp_double;
  pfVar7 = pfVar18 + -0xb;
  (pfVar7->encryption_key).bytes[0x14] = 0xc2;
  (pfVar7->encryption_key).bytes[0x15] = 'J';
  (pfVar7->encryption_key).bytes[0x16] = '\x11';
  (pfVar7->encryption_key).bytes[0x17] = '\0';
  (pfVar7->encryption_key).bytes[0x18] = '\0';
  (pfVar7->encryption_key).bytes[0x19] = '\0';
  (pfVar7->encryption_key).bytes[0x1a] = '\0';
  (pfVar7->encryption_key).bytes[0x1b] = '\0';
  fdb_open((fdb_file_handle **)&pfVar18[-0xb].log_msg_level,"./dummy1",
           (fdb_config *)&pfVar18[-9].num_compactor_threads);
  pfVar3 = (fdb_file_handle *)pfVar18[-0xb].log_msg_level;
  pfVar7 = pfVar18 + -0xb;
  (pfVar7->encryption_key).bytes[0x14] = 0xd6;
  (pfVar7->encryption_key).bytes[0x15] = 'J';
  (pfVar7->encryption_key).bytes[0x16] = '\x11';
  (pfVar7->encryption_key).bytes[0x17] = '\0';
  (pfVar7->encryption_key).bytes[0x18] = '\0';
  (pfVar7->encryption_key).bytes[0x19] = '\0';
  (pfVar7->encryption_key).bytes[0x1a] = '\0';
  (pfVar7->encryption_key).bytes[0x1b] = '\0';
  fdb_kvs_open_default
            (pfVar3,(fdb_kvs_handle **)&pfVar18[-0xb].breakpad_minidump_dir,
             (fdb_kvs_config *)(pfVar18 + -10));
  pfVar12 = (fdb_kvs_handle *)pfVar18[-0xb].breakpad_minidump_dir;
  __src = logCallbackFunc;
  pfVar7 = pfVar18 + -0xb;
  (pfVar7->encryption_key).bytes[0x14] = 0xec;
  (pfVar7->encryption_key).bytes[0x15] = 'J';
  (pfVar7->encryption_key).bytes[0x16] = '\x11';
  (pfVar7->encryption_key).bytes[0x17] = '\0';
  (pfVar7->encryption_key).bytes[0x18] = '\0';
  (pfVar7->encryption_key).bytes[0x19] = '\0';
  (pfVar7->encryption_key).bytes[0x1a] = '\0';
  (pfVar7->encryption_key).bytes[0x1b] = '\0';
  fVar8 = fdb_set_log_callback(pfVar12,logCallbackFunc,"custom_compare_primitive_test");
  if (fVar8 == FDB_RESULT_SUCCESS) {
    doc = (void **)&pfVar18[-10].wal_flush_before_commit;
    psVar31 = &pfVar18[-8].num_compactor_threads;
    lVar28 = 0;
    do {
      pvVar34 = (void *)(10000.0 / (double)(int)lVar28);
      pfVar18[-10].compaction_cb_ctx = pvVar34;
      pfVar18[-0xb].block_reusing_threshold = (size_t)pvVar34;
      pfVar7 = pfVar18 + -0xb;
      builtin_memcpy((pfVar7->encryption_key).bytes + 0x14,"GK\x11",4);
      (pfVar7->encryption_key).bytes[0x18] = '\0';
      (pfVar7->encryption_key).bytes[0x19] = '\0';
      (pfVar7->encryption_key).bytes[0x1a] = '\0';
      (pfVar7->encryption_key).bytes[0x1b] = '\0';
      sprintf((char *)psVar31,"value: %d, %f",(int)pvVar34,uVar16);
      pfVar7 = pfVar18 + -0xb;
      builtin_memcpy((pfVar7->encryption_key).bytes + 0x14,"OK\x11",4);
      (pfVar7->encryption_key).bytes[0x18] = '\0';
      (pfVar7->encryption_key).bytes[0x19] = '\0';
      (pfVar7->encryption_key).bytes[0x1a] = '\0';
      (pfVar7->encryption_key).bytes[0x1b] = '\0';
      sVar11 = strlen((char *)psVar31);
      *(size_t *)(pfVar18[-0xb].encryption_key.bytes + 0x1c) = sVar11 + 1;
      pfVar7 = pfVar18 + -0xb;
      builtin_memcpy((pfVar7->encryption_key).bytes + 0x14,"nK\x11",4);
      (pfVar7->encryption_key).bytes[0x18] = '\0';
      (pfVar7->encryption_key).bytes[0x19] = '\0';
      (pfVar7->encryption_key).bytes[0x1a] = '\0';
      (pfVar7->encryption_key).bytes[0x1b] = '\0';
      fdb_doc_create((fdb_doc **)doc,&pfVar18[-10].compaction_cb_ctx,8,(void *)0x0,0,psVar31,
                     *(size_t *)(pfVar18[-0xb].encryption_key.bytes + 0x1c));
      pfVar12 = (fdb_kvs_handle *)pfVar18[-0xb].breakpad_minidump_dir;
      pfVar4 = (fdb_doc *)*doc;
      pfVar7 = pfVar18 + -0xb;
      builtin_memcpy((pfVar7->encryption_key).bytes + 0x14,"{K\x11",4);
      (pfVar7->encryption_key).bytes[0x18] = '\0';
      (pfVar7->encryption_key).bytes[0x19] = '\0';
      (pfVar7->encryption_key).bytes[0x1a] = '\0';
      (pfVar7->encryption_key).bytes[0x1b] = '\0';
      fdb_set(pfVar12,pfVar4);
      lVar28 = lVar28 + 0xb;
      uVar16 = (ulong)((int)uVar16 + 1);
      doc = doc + 1;
    } while (lVar28 != 0x6e);
    psVar31 = &pfVar18[-0xb].num_keeping_headers;
    *psVar31 = pfVar18[-0xb].block_reusing_threshold;
    pfVar12 = (fdb_kvs_handle *)pfVar18[-0xb].breakpad_minidump_dir;
    (pfVar10->encryption_key).bytes[0x1c] = '\0';
    (pfVar10->encryption_key).bytes[0x1d] = '\0';
    (pfVar10->encryption_key).bytes[0x1e] = '\0';
    (pfVar10->encryption_key).bytes[0x1f] = '\0';
    in_RCX = (fdb_compaction_callback *)0x0;
    pfVar10 = pfVar18 + -0xb;
    (pfVar10->encryption_key).bytes[0x14] = 0xba;
    (pfVar10->encryption_key).bytes[0x15] = 'K';
    (pfVar10->encryption_key).bytes[0x16] = '\x11';
    (pfVar10->encryption_key).bytes[0x17] = '\0';
    (pfVar10->encryption_key).bytes[0x18] = '\0';
    (pfVar10->encryption_key).bytes[0x19] = '\0';
    (pfVar10->encryption_key).bytes[0x1a] = '\0';
    (pfVar10->encryption_key).bytes[0x1b] = '\0';
    fdb_iterator_init(pfVar12,(fdb_iterator **)&pfVar18[-0xb].min_block_reuse_filesize,(void *)0x0,0
                      ,(void *)0x0,0,
                      *(fdb_iterator_opt_t *)(pfVar18[-0xb].encryption_key.bytes + 0x1c));
    uVar32 = 0;
    uVar33 = 0xbff00000;
    do {
      pfVar18[-0xb].block_reusing_threshold = CONCAT44(uVar33,uVar32);
      pfVar12 = (fdb_kvs_handle *)pfVar18[-0xb].min_block_reuse_filesize;
      pfVar10 = pfVar18 + -0xb;
      (pfVar10->encryption_key).bytes[0x14] = 0xda;
      (pfVar10->encryption_key).bytes[0x15] = 'K';
      (pfVar10->encryption_key).bytes[0x16] = '\x11';
      (pfVar10->encryption_key).bytes[0x17] = '\0';
      (pfVar10->encryption_key).bytes[0x18] = '\0';
      (pfVar10->encryption_key).bytes[0x19] = '\0';
      (pfVar10->encryption_key).bytes[0x1a] = '\0';
      (pfVar10->encryption_key).bytes[0x1b] = '\0';
      __src = (code *)&pfVar18[-0xb].max_block_reusing_cycle;
      fVar8 = fdb_iterator_get((fdb_iterator *)pfVar12,
                               (fdb_doc **)&pfVar18[-0xb].max_block_reusing_cycle);
      if (fVar8 != FDB_RESULT_SUCCESS) {
LAB_00114e2d:
        pfVar10 = pfVar18 + -0xb;
        builtin_memcpy((pfVar10->encryption_key).bytes + 0x14,"2N\x11",4);
        (pfVar10->encryption_key).bytes[0x18] = '\0';
        (pfVar10->encryption_key).bytes[0x19] = '\0';
        (pfVar10->encryption_key).bytes[0x1a] = '\0';
        (pfVar10->encryption_key).bytes[0x1b] = '\0';
        custom_compare_primitive_test();
        goto LAB_00114e32;
      }
      pfVar4 = (fdb_doc *)pfVar18[-0xb].max_block_reusing_cycle;
      sVar11 = pfVar4->keylen;
      __src = (code *)pfVar4->key;
      pfVar10 = pfVar18 + -0xb;
      (pfVar10->encryption_key).bytes[0x14] = 0xf6;
      (pfVar10->encryption_key).bytes[0x15] = 'K';
      (pfVar10->encryption_key).bytes[0x16] = '\x11';
      (pfVar10->encryption_key).bytes[0x17] = '\0';
      (pfVar10->encryption_key).bytes[0x18] = '\0';
      (pfVar10->encryption_key).bytes[0x19] = '\0';
      (pfVar10->encryption_key).bytes[0x1a] = '\0';
      (pfVar10->encryption_key).bytes[0x1b] = '\0';
      pfVar12 = (fdb_kvs_handle *)psVar31;
      memcpy(psVar31,__src,sVar11);
      dVar1 = (double)pfVar18[-0xb].num_keeping_headers;
      if (dVar1 < (double)pfVar18[-0xb].block_reusing_threshold ||
          dVar1 == (double)pfVar18[-0xb].block_reusing_threshold) {
        pfVar10 = pfVar18 + -0xb;
        builtin_memcpy((pfVar10->encryption_key).bytes + 0x14,"-N\x11",4);
        (pfVar10->encryption_key).bytes[0x18] = '\0';
        (pfVar10->encryption_key).bytes[0x19] = '\0';
        (pfVar10->encryption_key).bytes[0x1a] = '\0';
        (pfVar10->encryption_key).bytes[0x1b] = '\0';
        custom_compare_primitive_test();
        goto LAB_00114e2d;
      }
      pfVar18[-0xb].block_reusing_threshold = (size_t)dVar1;
      pfVar10 = pfVar18 + -0xb;
      builtin_memcpy((pfVar10->encryption_key).bytes + 0x14,"\x16L\x11",4);
      (pfVar10->encryption_key).bytes[0x18] = '\0';
      (pfVar10->encryption_key).bytes[0x19] = '\0';
      (pfVar10->encryption_key).bytes[0x1a] = '\0';
      (pfVar10->encryption_key).bytes[0x1b] = '\0';
      fdb_doc_free(pfVar4);
      pfVar18[-0xb].max_block_reusing_cycle = 0;
      pfVar5 = (fdb_iterator *)pfVar18[-0xb].min_block_reuse_filesize;
      pfVar10 = pfVar18 + -0xb;
      builtin_memcpy((pfVar10->encryption_key).bytes + 0x14,")L\x11",4);
      (pfVar10->encryption_key).bytes[0x18] = '\0';
      (pfVar10->encryption_key).bytes[0x19] = '\0';
      (pfVar10->encryption_key).bytes[0x1a] = '\0';
      (pfVar10->encryption_key).bytes[0x1b] = '\0';
      fVar8 = fdb_iterator_next(pfVar5);
      uVar32 = (undefined4)pfVar18[-0xb].block_reusing_threshold;
      uVar33 = (undefined4)(pfVar18[-0xb].block_reusing_threshold >> 0x20);
    } while (fVar8 != FDB_RESULT_ITERATOR_FAIL);
    pfVar5 = (fdb_iterator *)pfVar18[-0xb].min_block_reuse_filesize;
    pfVar10 = pfVar18 + -0xb;
    builtin_memcpy((pfVar10->encryption_key).bytes + 0x14,"AL\x11",4);
    (pfVar10->encryption_key).bytes[0x18] = '\0';
    (pfVar10->encryption_key).bytes[0x19] = '\0';
    (pfVar10->encryption_key).bytes[0x1a] = '\0';
    (pfVar10->encryption_key).bytes[0x1b] = '\0';
    fdb_iterator_close(pfVar5);
    pfVar3 = (fdb_file_handle *)pfVar18[-0xb].log_msg_level;
    pfVar10 = pfVar18 + -0xb;
    builtin_memcpy((pfVar10->encryption_key).bytes + 0x14,"PL\x11",4);
    (pfVar10->encryption_key).bytes[0x18] = '\0';
    (pfVar10->encryption_key).bytes[0x19] = '\0';
    (pfVar10->encryption_key).bytes[0x1a] = '\0';
    (pfVar10->encryption_key).bytes[0x1b] = '\0';
    fdb_commit(pfVar3,'\x01');
    pfVar12 = (fdb_kvs_handle *)pfVar18[-0xb].breakpad_minidump_dir;
    (pfVar30->encryption_key).bytes[0x1c] = '\0';
    (pfVar30->encryption_key).bytes[0x1d] = '\0';
    (pfVar30->encryption_key).bytes[0x1e] = '\0';
    (pfVar30->encryption_key).bytes[0x1f] = '\0';
    in_RCX = (fdb_compaction_callback *)0x0;
    pfVar10 = pfVar18 + -0xb;
    builtin_memcpy((pfVar10->encryption_key).bytes + 0x14,"nL\x11",4);
    (pfVar10->encryption_key).bytes[0x18] = '\0';
    (pfVar10->encryption_key).bytes[0x19] = '\0';
    (pfVar10->encryption_key).bytes[0x1a] = '\0';
    (pfVar10->encryption_key).bytes[0x1b] = '\0';
    fdb_iterator_init(pfVar12,(fdb_iterator **)&pfVar18[-0xb].min_block_reuse_filesize,(void *)0x0,0
                      ,(void *)0x0,0,
                      *(fdb_iterator_opt_t *)(pfVar18[-0xb].encryption_key.bytes + 0x1c));
    uVar32 = 0;
    uVar33 = 0xbff00000;
    do {
      pfVar18[-0xb].block_reusing_threshold = CONCAT44(uVar33,uVar32);
      pfVar12 = (fdb_kvs_handle *)pfVar18[-0xb].min_block_reuse_filesize;
      pfVar10 = pfVar18 + -0xb;
      (pfVar10->encryption_key).bytes[0x14] = 0x93;
      (pfVar10->encryption_key).bytes[0x15] = 'L';
      (pfVar10->encryption_key).bytes[0x16] = '\x11';
      (pfVar10->encryption_key).bytes[0x17] = '\0';
      (pfVar10->encryption_key).bytes[0x18] = '\0';
      (pfVar10->encryption_key).bytes[0x19] = '\0';
      (pfVar10->encryption_key).bytes[0x1a] = '\0';
      (pfVar10->encryption_key).bytes[0x1b] = '\0';
      __src = (code *)&pfVar18[-0xb].max_block_reusing_cycle;
      fVar8 = fdb_iterator_get((fdb_iterator *)pfVar12,
                               (fdb_doc **)&pfVar18[-0xb].max_block_reusing_cycle);
      if (fVar8 != FDB_RESULT_SUCCESS) goto LAB_00114e37;
      pfVar4 = (fdb_doc *)pfVar18[-0xb].max_block_reusing_cycle;
      sVar11 = pfVar4->keylen;
      __src = (code *)pfVar4->key;
      pfVar10 = pfVar18 + -0xb;
      (pfVar10->encryption_key).bytes[0x14] = 0xaf;
      (pfVar10->encryption_key).bytes[0x15] = 'L';
      (pfVar10->encryption_key).bytes[0x16] = '\x11';
      (pfVar10->encryption_key).bytes[0x17] = '\0';
      (pfVar10->encryption_key).bytes[0x18] = '\0';
      (pfVar10->encryption_key).bytes[0x19] = '\0';
      (pfVar10->encryption_key).bytes[0x1a] = '\0';
      (pfVar10->encryption_key).bytes[0x1b] = '\0';
      pfVar12 = (fdb_kvs_handle *)&pfVar18[-0xb].num_keeping_headers;
      memcpy(&pfVar18[-0xb].num_keeping_headers,__src,sVar11);
      dVar1 = (double)pfVar18[-0xb].num_keeping_headers;
      if (dVar1 < (double)pfVar18[-0xb].block_reusing_threshold ||
          dVar1 == (double)pfVar18[-0xb].block_reusing_threshold) goto LAB_00114e32;
      pfVar18[-0xb].block_reusing_threshold = (size_t)dVar1;
      pfVar10 = pfVar18 + -0xb;
      (pfVar10->encryption_key).bytes[0x14] = 0xcf;
      (pfVar10->encryption_key).bytes[0x15] = 'L';
      (pfVar10->encryption_key).bytes[0x16] = '\x11';
      (pfVar10->encryption_key).bytes[0x17] = '\0';
      (pfVar10->encryption_key).bytes[0x18] = '\0';
      (pfVar10->encryption_key).bytes[0x19] = '\0';
      (pfVar10->encryption_key).bytes[0x1a] = '\0';
      (pfVar10->encryption_key).bytes[0x1b] = '\0';
      fdb_doc_free(pfVar4);
      pfVar18[-0xb].max_block_reusing_cycle = 0;
      pfVar5 = (fdb_iterator *)pfVar18[-0xb].min_block_reuse_filesize;
      pfVar10 = pfVar18 + -0xb;
      (pfVar10->encryption_key).bytes[0x14] = 0xe2;
      (pfVar10->encryption_key).bytes[0x15] = 'L';
      (pfVar10->encryption_key).bytes[0x16] = '\x11';
      (pfVar10->encryption_key).bytes[0x17] = '\0';
      (pfVar10->encryption_key).bytes[0x18] = '\0';
      (pfVar10->encryption_key).bytes[0x19] = '\0';
      (pfVar10->encryption_key).bytes[0x1a] = '\0';
      (pfVar10->encryption_key).bytes[0x1b] = '\0';
      fVar8 = fdb_iterator_next(pfVar5);
      uVar32 = (undefined4)pfVar18[-0xb].block_reusing_threshold;
      uVar33 = (undefined4)(pfVar18[-0xb].block_reusing_threshold >> 0x20);
    } while (fVar8 != FDB_RESULT_ITERATOR_FAIL);
    pfVar5 = (fdb_iterator *)pfVar18[-0xb].min_block_reuse_filesize;
    pfVar10 = pfVar18 + -0xb;
    (pfVar10->encryption_key).bytes[0x14] = 0xfa;
    (pfVar10->encryption_key).bytes[0x15] = 'L';
    (pfVar10->encryption_key).bytes[0x16] = '\x11';
    (pfVar10->encryption_key).bytes[0x17] = '\0';
    (pfVar10->encryption_key).bytes[0x18] = '\0';
    (pfVar10->encryption_key).bytes[0x19] = '\0';
    (pfVar10->encryption_key).bytes[0x1a] = '\0';
    (pfVar10->encryption_key).bytes[0x1b] = '\0';
    fdb_iterator_close(pfVar5);
    pfVar3 = (fdb_file_handle *)pfVar18[-0xb].log_msg_level;
    pfVar10 = pfVar18 + -0xb;
    builtin_memcpy((pfVar10->encryption_key).bytes + 0x14,"\vM\x11",4);
    (pfVar10->encryption_key).bytes[0x18] = '\0';
    (pfVar10->encryption_key).bytes[0x19] = '\0';
    (pfVar10->encryption_key).bytes[0x1a] = '\0';
    (pfVar10->encryption_key).bytes[0x1b] = '\0';
    fdb_compact(pfVar3,"./dummy2");
    pfVar12 = (fdb_kvs_handle *)pfVar18[-0xb].breakpad_minidump_dir;
    (pfVar6->encryption_key).bytes[0x1c] = '\0';
    (pfVar6->encryption_key).bytes[0x1d] = '\0';
    (pfVar6->encryption_key).bytes[0x1e] = '\0';
    (pfVar6->encryption_key).bytes[0x1f] = '\0';
    in_RCX = (fdb_compaction_callback *)0x0;
    pfVar10 = pfVar18 + -0xb;
    builtin_memcpy((pfVar10->encryption_key).bytes + 0x14,")M\x11",4);
    (pfVar10->encryption_key).bytes[0x18] = '\0';
    (pfVar10->encryption_key).bytes[0x19] = '\0';
    (pfVar10->encryption_key).bytes[0x1a] = '\0';
    (pfVar10->encryption_key).bytes[0x1b] = '\0';
    fdb_iterator_init(pfVar12,(fdb_iterator **)&pfVar18[-0xb].min_block_reuse_filesize,(void *)0x0,0
                      ,(void *)0x0,0,
                      *(fdb_iterator_opt_t *)(pfVar18[-0xb].encryption_key.bytes + 0x1c));
    uVar32 = 0;
    uVar33 = 0xbff00000;
    while( true ) {
      pfVar18[-0xb].block_reusing_threshold = CONCAT44(uVar33,uVar32);
      pfVar12 = (fdb_kvs_handle *)pfVar18[-0xb].min_block_reuse_filesize;
      pfVar10 = pfVar18 + -0xb;
      builtin_memcpy((pfVar10->encryption_key).bytes + 0x14,"NM\x11",4);
      (pfVar10->encryption_key).bytes[0x18] = '\0';
      (pfVar10->encryption_key).bytes[0x19] = '\0';
      (pfVar10->encryption_key).bytes[0x1a] = '\0';
      (pfVar10->encryption_key).bytes[0x1b] = '\0';
      __src = (code *)&pfVar18[-0xb].max_block_reusing_cycle;
      fVar8 = fdb_iterator_get((fdb_iterator *)pfVar12,
                               (fdb_doc **)&pfVar18[-0xb].max_block_reusing_cycle);
      if (fVar8 != FDB_RESULT_SUCCESS) break;
      pfVar4 = (fdb_doc *)pfVar18[-0xb].max_block_reusing_cycle;
      sVar11 = pfVar4->keylen;
      __src = (code *)pfVar4->key;
      pfVar10 = pfVar18 + -0xb;
      builtin_memcpy((pfVar10->encryption_key).bytes + 0x14,"jM\x11",4);
      (pfVar10->encryption_key).bytes[0x18] = '\0';
      (pfVar10->encryption_key).bytes[0x19] = '\0';
      (pfVar10->encryption_key).bytes[0x1a] = '\0';
      (pfVar10->encryption_key).bytes[0x1b] = '\0';
      pfVar12 = (fdb_kvs_handle *)&pfVar18[-0xb].num_keeping_headers;
      memcpy(&pfVar18[-0xb].num_keeping_headers,__src,sVar11);
      dVar1 = (double)pfVar18[-0xb].num_keeping_headers;
      if (dVar1 < (double)pfVar18[-0xb].block_reusing_threshold ||
          dVar1 == (double)pfVar18[-0xb].block_reusing_threshold) goto LAB_00114e3c;
      pfVar18[-0xb].block_reusing_threshold = (size_t)dVar1;
      pfVar10 = pfVar18 + -0xb;
      (pfVar10->encryption_key).bytes[0x14] = 0x8a;
      (pfVar10->encryption_key).bytes[0x15] = 'M';
      (pfVar10->encryption_key).bytes[0x16] = '\x11';
      (pfVar10->encryption_key).bytes[0x17] = '\0';
      (pfVar10->encryption_key).bytes[0x18] = '\0';
      (pfVar10->encryption_key).bytes[0x19] = '\0';
      (pfVar10->encryption_key).bytes[0x1a] = '\0';
      (pfVar10->encryption_key).bytes[0x1b] = '\0';
      fdb_doc_free(pfVar4);
      pfVar18[-0xb].max_block_reusing_cycle = 0;
      pfVar5 = (fdb_iterator *)pfVar18[-0xb].min_block_reuse_filesize;
      pfVar10 = pfVar18 + -0xb;
      (pfVar10->encryption_key).bytes[0x14] = 0x9d;
      (pfVar10->encryption_key).bytes[0x15] = 'M';
      (pfVar10->encryption_key).bytes[0x16] = '\x11';
      (pfVar10->encryption_key).bytes[0x17] = '\0';
      (pfVar10->encryption_key).bytes[0x18] = '\0';
      (pfVar10->encryption_key).bytes[0x19] = '\0';
      (pfVar10->encryption_key).bytes[0x1a] = '\0';
      (pfVar10->encryption_key).bytes[0x1b] = '\0';
      fVar8 = fdb_iterator_next(pfVar5);
      uVar32 = (undefined4)pfVar18[-0xb].block_reusing_threshold;
      uVar33 = (undefined4)(pfVar18[-0xb].block_reusing_threshold >> 0x20);
      if (fVar8 == FDB_RESULT_ITERATOR_FAIL) {
        pfVar5 = (fdb_iterator *)pfVar18[-0xb].min_block_reuse_filesize;
        pfVar10 = pfVar18 + -0xb;
        (pfVar10->encryption_key).bytes[0x14] = 0xb2;
        (pfVar10->encryption_key).bytes[0x15] = 'M';
        (pfVar10->encryption_key).bytes[0x16] = '\x11';
        (pfVar10->encryption_key).bytes[0x17] = '\0';
        (pfVar10->encryption_key).bytes[0x18] = '\0';
        (pfVar10->encryption_key).bytes[0x19] = '\0';
        (pfVar10->encryption_key).bytes[0x1a] = '\0';
        (pfVar10->encryption_key).bytes[0x1b] = '\0';
        fdb_iterator_close(pfVar5);
        pfVar12 = (fdb_kvs_handle *)pfVar18[-0xb].breakpad_minidump_dir;
        pfVar10 = pfVar18 + -0xb;
        (pfVar10->encryption_key).bytes[0x14] = 0xbc;
        (pfVar10->encryption_key).bytes[0x15] = 'M';
        (pfVar10->encryption_key).bytes[0x16] = '\x11';
        (pfVar10->encryption_key).bytes[0x17] = '\0';
        (pfVar10->encryption_key).bytes[0x18] = '\0';
        (pfVar10->encryption_key).bytes[0x19] = '\0';
        (pfVar10->encryption_key).bytes[0x1a] = '\0';
        (pfVar10->encryption_key).bytes[0x1b] = '\0';
        fdb_kvs_close(pfVar12);
        pfVar3 = (fdb_file_handle *)pfVar18[-0xb].log_msg_level;
        pfVar10 = pfVar18 + -0xb;
        (pfVar10->encryption_key).bytes[0x14] = 0xc6;
        (pfVar10->encryption_key).bytes[0x15] = 'M';
        (pfVar10->encryption_key).bytes[0x16] = '\x11';
        (pfVar10->encryption_key).bytes[0x17] = '\0';
        (pfVar10->encryption_key).bytes[0x18] = '\0';
        (pfVar10->encryption_key).bytes[0x19] = '\0';
        (pfVar10->encryption_key).bytes[0x1a] = '\0';
        (pfVar10->encryption_key).bytes[0x1b] = '\0';
        fdb_close(pfVar3);
        lVar28 = 0;
        do {
          pfVar4 = *(fdb_doc **)((long)pfVar18 + lVar28 * 8 + -0x998);
          pfVar10 = pfVar18 + -0xb;
          (pfVar10->encryption_key).bytes[0x14] = 0xd2;
          (pfVar10->encryption_key).bytes[0x15] = 'M';
          (pfVar10->encryption_key).bytes[0x16] = '\x11';
          (pfVar10->encryption_key).bytes[0x17] = '\0';
          (pfVar10->encryption_key).bytes[0x18] = '\0';
          (pfVar10->encryption_key).bytes[0x19] = '\0';
          (pfVar10->encryption_key).bytes[0x1a] = '\0';
          (pfVar10->encryption_key).bytes[0x1b] = '\0';
          fdb_doc_free(pfVar4);
          lVar28 = lVar28 + 1;
        } while (lVar28 != 10);
        pfVar10 = pfVar18 + -0xb;
        (pfVar10->encryption_key).bytes[0x14] = 0xe0;
        (pfVar10->encryption_key).bytes[0x15] = 'M';
        (pfVar10->encryption_key).bytes[0x16] = '\x11';
        (pfVar10->encryption_key).bytes[0x17] = '\0';
        (pfVar10->encryption_key).bytes[0x18] = '\0';
        (pfVar10->encryption_key).bytes[0x19] = '\0';
        (pfVar10->encryption_key).bytes[0x1a] = '\0';
        (pfVar10->encryption_key).bytes[0x1b] = '\0';
        fdb_shutdown();
        pfVar10 = pfVar18 + -0xb;
        (pfVar10->encryption_key).bytes[0x14] = 0xe5;
        (pfVar10->encryption_key).bytes[0x15] = 'M';
        (pfVar10->encryption_key).bytes[0x16] = '\x11';
        (pfVar10->encryption_key).bytes[0x17] = '\0';
        (pfVar10->encryption_key).bytes[0x18] = '\0';
        (pfVar10->encryption_key).bytes[0x19] = '\0';
        (pfVar10->encryption_key).bytes[0x1a] = '\0';
        (pfVar10->encryption_key).bytes[0x1b] = '\0';
        memleak_end();
        pcVar29 = "%s PASSED\n";
        if (custom_compare_primitive_test()::__test_pass != '\0') {
          pcVar29 = "%s FAILED\n";
        }
        pfVar18 = pfVar18 + -0xb;
        builtin_memcpy((pfVar18->encryption_key).bytes + 0x14,"\x16N\x11",4);
        (pfVar18->encryption_key).bytes[0x18] = '\0';
        (pfVar18->encryption_key).bytes[0x19] = '\0';
        (pfVar18->encryption_key).bytes[0x1a] = '\0';
        (pfVar18->encryption_key).bytes[0x1b] = '\0';
        iVar9 = fprintf(_stderr,pcVar29,"custom compare function for primitive key test");
        return (void *)CONCAT44(extraout_var_00,iVar9);
      }
    }
LAB_00114e41:
    pfVar10 = pfVar18 + -0xb;
    builtin_memcpy((pfVar10->encryption_key).bytes + 0x14,"FN\x11",4);
    (pfVar10->encryption_key).bytes[0x18] = '\0';
    (pfVar10->encryption_key).bytes[0x19] = '\0';
    (pfVar10->encryption_key).bytes[0x1a] = '\0';
    (pfVar10->encryption_key).bytes[0x1b] = '\0';
    custom_compare_primitive_test();
  }
  *(code **)(pfVar18[-0xb].encryption_key.bytes + 0x14) = _cmp_double;
  custom_compare_primitive_test();
  pvVar34 = (void *)0xffffffff;
  if (__src != (code *)0x0) {
    if (in_RCX == (fdb_compaction_callback *)0x0) {
      return (void *)0x1;
    }
    if (*extraout_RDX <= *(double *)&pfVar12->kvs_config) {
      pvVar34 = (void *)(ulong)(*extraout_RDX < *(double *)&pfVar12->kvs_config);
    }
  }
  return pvVar34;
}

Assistant:

void *multi_thread_kvs_client(void *args)
{

    TEST_INIT();

    int i, j, r;
    int n = 50;
    int nclients = 20;
    int *tid_args = alca(int, nclients);
    char dbstr[256];
    char keybuf[256], metabuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *tdb;
    fdb_kvs_handle **db = alca(fdb_kvs_handle*, nclients);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    fdb_seqnum_t seqnum;
    thread_t *tid;
    void **thread_ret;

    if (args == NULL)
    { // parent
        memleak_start();

        r = system(SHELL_DEL" dummy* > errorlog.txt");
        (void)r;

        // init dbfile
        fconfig = fdb_get_default_config();
        fconfig.buffercache_size = 0;
        fconfig.wal_threshold = 1024;
        fconfig.compaction_threshold = 0;

        status = fdb_open(&dbfile, "./dummy1", &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        tid = alca(thread_t, nclients);
        thread_ret = alca(void *, nclients);
        for (i=0;i<nclients;++i){
            sprintf(dbstr, "db%d", i);
            kvs_config = fdb_get_default_kvs_config();
            status = fdb_kvs_open(dbfile, &db[i], dbstr, &kvs_config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_kvs_close(db[i]);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
        for (i=0;i<nclients;++i){
            tid_args[i] = i;
            thread_create(&tid[i], multi_thread_kvs_client,
                          (void *)&tid_args[i]);
        }
        for (i=0;i<nclients;++i){
            thread_join(tid[i], &thread_ret[i]);
        }

        status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // check threads updated kvs
        for (i=0; i<nclients; i++){
            sprintf(dbstr, "db%d", i);
            kvs_config = fdb_get_default_kvs_config();
            status = fdb_kvs_open(dbfile, &db[i], dbstr, &kvs_config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);

            // verify seqnum
            status = fdb_get_kvs_seqnum(db[i], &seqnum);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CHK(seqnum == (fdb_seqnum_t)n);

            for (j=0; j<n; j++){
                sprintf(keybuf, "key%d", j);
                sprintf(metabuf, "meta%d", j);
                sprintf(bodybuf, "body%d", j);
                fdb_doc_create(&rdoc, keybuf, strlen(keybuf),
                                      NULL, 0, NULL, 0);
                status = fdb_get(db[i], rdoc);
                TEST_CHK(status == FDB_RESULT_SUCCESS);
                TEST_CHK(!memcmp(rdoc->key, keybuf, strlen(keybuf)));
                TEST_CHK(!memcmp(rdoc->meta, metabuf, rdoc->metalen));
                TEST_CHK(!memcmp(rdoc->body, bodybuf, rdoc->bodylen));
                fdb_doc_free(rdoc);
            }
            status = fdb_kvs_close(db[i]);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }

        status = fdb_close(dbfile);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_shutdown();
        memleak_end();
        TEST_RESULT("multi thread kvs client");
        return NULL;
    }

    // threads enter here //

    // open fhandle
    fconfig = fdb_get_default_config();
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // get kvs ID from args
    memcpy(&i, args, sizeof(int));
    sprintf(dbstr, "db%d", i);
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_kvs_open(dbfile, &tdb, dbstr, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
        status = fdb_set(tdb, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc[i]);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_close(dbfile);
    return NULL;
}